

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Option * ncnn::get_masked_option(Option *opt,int featmask)

{
  uint in_EDX;
  void *in_RSI;
  Option *in_RDI;
  Option *opt1;
  byte local_2b;
  byte local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  byte local_d;
  
  memcpy(in_RDI,in_RSI,0x40);
  local_d = 0;
  if ((in_RDI->use_fp16_arithmetic & 1U) != 0) {
    local_d = (in_EDX & 1) != 0 ^ 0xff;
  }
  in_RDI->use_fp16_arithmetic = (bool)(local_d & 1);
  local_21 = 0;
  if ((in_RDI->use_fp16_storage & 1U) != 0) {
    local_21 = (in_EDX & 2) != 0 ^ 0xff;
  }
  in_RDI->use_fp16_storage = (bool)(local_21 & 1);
  local_22 = 0;
  if ((in_RDI->use_fp16_packed & 1U) != 0) {
    local_22 = (in_EDX & 2) != 0 ^ 0xff;
  }
  in_RDI->use_fp16_packed = (bool)(local_22 & 1);
  local_23 = 0;
  if ((in_RDI->use_bf16_storage & 1U) != 0) {
    local_23 = (in_EDX & 4) != 0 ^ 0xff;
  }
  in_RDI->use_bf16_storage = (bool)(local_23 & 1);
  local_24 = 0;
  if ((in_RDI->use_int8_packed & 1U) != 0) {
    local_24 = (in_EDX & 8) != 0 ^ 0xff;
  }
  in_RDI->use_int8_packed = (bool)(local_24 & 1);
  local_25 = 0;
  if ((in_RDI->use_int8_storage & 1U) != 0) {
    local_25 = (in_EDX & 8) != 0 ^ 0xff;
  }
  in_RDI->use_int8_storage = (bool)(local_25 & 1);
  local_26 = 0;
  if ((in_RDI->use_int8_arithmetic & 1U) != 0) {
    local_26 = (in_EDX & 8) != 0 ^ 0xff;
  }
  in_RDI->use_int8_arithmetic = (bool)(local_26 & 1);
  local_27 = 0;
  if ((in_RDI->use_vulkan_compute & 1U) != 0) {
    local_27 = (in_EDX & 0x10) != 0 ^ 0xff;
  }
  in_RDI->use_vulkan_compute = (bool)(local_27 & 1);
  local_28 = 0;
  if ((in_RDI->use_image_storage & 1U) != 0) {
    local_28 = (in_EDX & 0x10) != 0 ^ 0xff;
  }
  in_RDI->use_image_storage = (bool)(local_28 & 1);
  local_29 = 0;
  if ((in_RDI->use_tensor_storage & 1U) != 0) {
    local_29 = (in_EDX & 0x10) != 0 ^ 0xff;
  }
  in_RDI->use_tensor_storage = (bool)(local_29 & 1);
  local_2a = 0;
  if ((in_RDI->use_sgemm_convolution & 1U) != 0) {
    local_2a = (in_EDX & 0x20) != 0 ^ 0xff;
  }
  in_RDI->use_sgemm_convolution = (bool)(local_2a & 1);
  local_2b = 0;
  if ((in_RDI->use_winograd_convolution & 1U) != 0) {
    local_2b = (in_EDX & 0x40) != 0 ^ 0xff;
  }
  in_RDI->use_winograd_convolution = (bool)(local_2b & 1);
  if ((in_EDX & 0x80) != 0) {
    in_RDI->num_threads = 1;
  }
  return in_RDI;
}

Assistant:

static Option get_masked_option(const Option& opt, int featmask)
{
    // mask option usage as layer specific featmask
    Option opt1 = opt;
    opt1.use_fp16_arithmetic = opt1.use_fp16_arithmetic && !(featmask & (1 << 0));
    opt1.use_fp16_storage = opt1.use_fp16_storage && !(featmask & (1 << 1));
    opt1.use_fp16_packed = opt1.use_fp16_packed && !(featmask & (1 << 1));
    opt1.use_bf16_storage = opt1.use_bf16_storage && !(featmask & (1 << 2));
    opt1.use_int8_packed = opt1.use_int8_packed && !(featmask & (1 << 3));
    opt1.use_int8_storage = opt1.use_int8_storage && !(featmask & (1 << 3));
    opt1.use_int8_arithmetic = opt1.use_int8_arithmetic && !(featmask & (1 << 3));
    opt1.use_vulkan_compute = opt1.use_vulkan_compute && !(featmask & (1 << 4));
    opt1.use_image_storage = opt1.use_image_storage && !(featmask & (1 << 4));
    opt1.use_tensor_storage = opt1.use_tensor_storage && !(featmask & (1 << 4));
    opt1.use_sgemm_convolution = opt1.use_sgemm_convolution && !(featmask & (1 << 5));
    opt1.use_winograd_convolution = opt1.use_winograd_convolution && !(featmask & (1 << 6));

    if (featmask & (1 << 7))
        opt1.num_threads = 1;

    return opt1;
}